

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O2

void __thiscall nv::AlphaBlockDXT5::evaluatePalette8(AlphaBlockDXT5 *this,uint8 *alpha)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  
  uVar1 = (this->field_0).u;
  *alpha = (uint8)uVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1 & 0xffff | ((this->field_0).u >> 8 & 0xffff) << 0x10;
  auVar7 = auVar7 & _DAT_001d7370;
  auVar9 = pshuflw(in_XMM1,auVar7,0x10);
  uVar2 = auVar7._2_2_;
  alpha[1] = (uint8)((this->field_0).u >> 8);
  uVar3 = (ushort)(uVar2 * 2 + auVar9._2_2_ * 5) / 7;
  uVar4 = (ushort)(uVar2 + auVar9._0_2_ * 6) / 7;
  uVar5 = (ushort)(auVar7._0_2_ * 4 + auVar9._4_2_ * 3) / 7;
  uVar6 = (ushort)(uVar2 * 4 + auVar9._6_2_ * 3) / 7;
  uVar8 = uVar4 & 0xff;
  uVar10 = uVar3 & 0xff;
  uVar11 = uVar5 & 0xff;
  uVar12 = uVar6 & 0xff;
  *(uint *)(alpha + 2) =
       CONCAT13((uVar12 != 0) * (uVar12 < 0x100) * (char)uVar6 - (0xff < uVar12),
                CONCAT12((uVar11 != 0) * (uVar11 < 0x100) * (char)uVar5 - (0xff < uVar11),
                         CONCAT11((uVar10 != 0) * (uVar10 < 0x100) * (char)uVar3 - (0xff < uVar10),
                                  (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar4 - (0xff < uVar8))));
  alpha[6] = (uint8)((ushort)(uVar2 * 5 + auVar7._0_2_ * 2) / 7);
  alpha[7] = (uint8)(((uint)uVar2 * 6 + auVar7._0_4_ & 0xffff) / 7);
  return;
}

Assistant:

void AlphaBlockDXT5::evaluatePalette8(uint8 alpha[8]) const
{
	// 8-alpha block:  derive the other six alphas.
	// Bit code 000 = alpha0, 001 = alpha1, others are interpolated.
	alpha[0] = alpha0;
	alpha[1] = alpha1;
	alpha[2] = (6 * alpha[0] + 1 * alpha[1]) / 7;	// bit code 010
	alpha[3] = (5 * alpha[0] + 2 * alpha[1]) / 7;	// bit code 011
	alpha[4] = (4 * alpha[0] + 3 * alpha[1]) / 7;	// bit code 100
	alpha[5] = (3 * alpha[0] + 4 * alpha[1]) / 7;	// bit code 101
	alpha[6] = (2 * alpha[0] + 5 * alpha[1]) / 7;	// bit code 110
	alpha[7] = (1 * alpha[0] + 6 * alpha[1]) / 7;	// bit code 111
}